

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void ERR_clear_error(void)

{
  ERR_STATE *pEVar1;
  uint local_14;
  uint i;
  ERR_STATE *state;
  
  pEVar1 = err_get_state();
  if (pEVar1 != (ERR_STATE *)0x0) {
    for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
      err_clear(pEVar1->errors + local_14);
    }
    free(pEVar1->to_free);
    pEVar1->to_free = (void *)0x0;
    pEVar1->bottom = 0;
    pEVar1->top = 0;
  }
  return;
}

Assistant:

void ERR_clear_error(void) {
  ERR_STATE *const state = err_get_state();
  unsigned i;

  if (state == NULL) {
    return;
  }

  for (i = 0; i < ERR_NUM_ERRORS; i++) {
    err_clear(&state->errors[i]);
  }
  free(state->to_free);
  state->to_free = NULL;

  state->top = state->bottom = 0;
}